

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O1

UniValue *
JSONRPCReplyObj(UniValue *__return_storage_ptr__,UniValue result,UniValue error,
               optional<UniValue> id,JSONRPCVersion jsonrpc_version)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  undefined4 *in_RCX;
  int *in_RDX;
  long *plVar8;
  undefined4 in_register_00000034;
  undefined4 *puVar9;
  long *plVar10;
  int in_R8D;
  long in_FS_OFFSET;
  undefined1 in_stack_fffffffffffffcc8 [12];
  int in_stack_fffffffffffffcd4;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  undefined8 in_stack_fffffffffffffce0;
  long *plVar11;
  undefined8 in_stack_fffffffffffffce8;
  long in_stack_fffffffffffffcf0;
  long lVar12;
  undefined8 in_stack_fffffffffffffcf8;
  pointer in_stack_fffffffffffffd00;
  pointer in_stack_fffffffffffffd08;
  pointer in_stack_fffffffffffffd10;
  pointer in_stack_fffffffffffffd18;
  pointer in_stack_fffffffffffffd20;
  pointer in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  pointer in_stack_fffffffffffffd38;
  long local_2c0 [2];
  int local_2b0;
  long *local_2a8;
  undefined8 local_2a0;
  long local_298;
  undefined8 uStack_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  vector<UniValue,_std::allocator<UniValue>_> local_270;
  long *local_258 [2];
  long local_248 [2];
  VType local_238;
  long *local_230 [2];
  long local_220 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  vector<UniValue,_std::allocator<UniValue>_> local_1f8;
  long *local_1e0 [2];
  long local_1d0 [2];
  VType local_1c0;
  long *local_1b8 [2];
  long local_1a8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  vector<UniValue,_std::allocator<UniValue>_> local_180;
  long *local_168 [2];
  long local_158 [2];
  undefined4 local_148;
  long *local_140;
  undefined8 local_138;
  long local_130;
  undefined8 uStack_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  vector<UniValue,_std::allocator<UniValue>_> local_108;
  long *local_f0 [2];
  long local_e0 [2];
  UniValue local_d0;
  long *local_78 [2];
  long local_68 [2];
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_47;
  undefined4 local_3f;
  undefined2 local_3b;
  char local_39;
  long local_38;
  
  puVar9 = (undefined4 *)CONCAT44(in_register_00000034,jsonrpc_version);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &local_48;
  __return_storage_ptr__->typ = VOBJ;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_47;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_3f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_3b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_39;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_50 = 0;
  local_48 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (in_R8D == 1) {
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"jsonrpc","");
    UniValue::UniValue<const_char_(&)[4],_char[4],_true>(&local_d0,(char (*) [4])"2.0");
    key._M_string_length._4_4_ = in_R8D;
    key._0_12_ = in_stack_fffffffffffffcc8;
    key.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffcd8;
    key.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffcdc;
    key.field_2._8_8_ = in_stack_fffffffffffffce0;
    val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffcf0;
    val._0_8_ = in_stack_fffffffffffffce8;
    val.val._M_string_length = in_stack_fffffffffffffcf8;
    val.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffd00;
    val.val.field_2._8_8_ = in_stack_fffffffffffffd08;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffd10;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd18;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd20;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = in_stack_fffffffffffffd28;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd30;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffd38;
    UniValue::pushKV(__return_storage_ptr__,key,val);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_d0.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d0.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.val._M_dataplus._M_p != &local_d0.val.field_2) {
      operator_delete(local_d0.val._M_dataplus._M_p,local_d0.val.field_2._M_allocated_capacity + 1);
    }
    in_stack_fffffffffffffcd4 = in_R8D;
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
  }
  if (*in_RDX == 0) {
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"result","");
    local_148 = *puVar9;
    plVar8 = (long *)(puVar9 + 6);
    if (*(long **)(puVar9 + 2) == plVar8) {
      local_130 = *plVar8;
      uStack_128 = *(undefined8 *)(puVar9 + 8);
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar8;
      local_140 = *(long **)(puVar9 + 2);
    }
    local_138 = *(undefined8 *)(puVar9 + 4);
    *(long **)(puVar9 + 2) = plVar8;
    *(undefined8 *)(puVar9 + 4) = 0;
    *(undefined1 *)(puVar9 + 6) = 0;
    local_120.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(puVar9 + 10);
    local_120.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(puVar9 + 0xc);
    local_120.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(puVar9 + 0xe);
    *(undefined8 *)(puVar9 + 0xe) = 0;
    *(undefined8 *)(puVar9 + 10) = 0;
    *(undefined8 *)(puVar9 + 0xc) = 0;
    local_108.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)(puVar9 + 0x10);
    local_108.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = *(pointer *)(puVar9 + 0x12);
    local_108.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)(puVar9 + 0x14);
    *(undefined8 *)(puVar9 + 0x14) = 0;
    *(undefined8 *)(puVar9 + 0x10) = 0;
    *(undefined8 *)(puVar9 + 0x12) = 0;
    key_02._M_string_length._4_4_ = in_stack_fffffffffffffcd4;
    key_02._0_12_ = in_stack_fffffffffffffcc8;
    key_02.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffcd8;
    key_02.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffcdc;
    key_02.field_2._8_8_ = in_stack_fffffffffffffce0;
    val_02.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffcf0;
    val_02._0_8_ = in_stack_fffffffffffffce8;
    val_02.val._M_string_length = in_stack_fffffffffffffcf8;
    val_02.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffd00;
    val_02.val.field_2._8_8_ = in_stack_fffffffffffffd08;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffd10;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd18;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd20;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = in_stack_fffffffffffffd28;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd30;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffd38;
    UniValue::pushKV(__return_storage_ptr__,key_02,val_02);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_120);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_f0[0] != local_e0) {
      operator_delete(local_f0[0],local_e0[0] + 1);
    }
    if (in_R8D == 0) {
      plVar8 = local_158;
      local_168[0] = plVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"error","");
      local_1c0 = NullUniValue.typ;
      local_1b8[0] = local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b8,NullUniValue.val._M_dataplus._M_p,
                 NullUniValue.val._M_dataplus._M_p + NullUniValue.val._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_198,&NullUniValue.keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_180,&NullUniValue.values);
      key_04._M_string_length._4_4_ = in_stack_fffffffffffffcd4;
      key_04._0_12_ = in_stack_fffffffffffffcc8;
      key_04.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffcd8;
      key_04.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffcdc;
      key_04.field_2._8_8_ = in_stack_fffffffffffffce0;
      val_04.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffcf0;
      val_04._0_8_ = in_stack_fffffffffffffce8;
      val_04.val._M_string_length = in_stack_fffffffffffffcf8;
      val_04.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffd00;
      val_04.val.field_2._8_8_ = in_stack_fffffffffffffd08;
      val_04.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffd10;
      val_04.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd18;
      val_04.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd20;
      val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = in_stack_fffffffffffffd28;
      val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd30;
      val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffd38;
      UniValue::pushKV(__return_storage_ptr__,key_04,val_04);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_180);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_198);
      plVar10 = local_168[0];
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0],local_1a8[0] + 1);
        plVar10 = local_168[0];
      }
      goto LAB_0037556f;
    }
  }
  else {
    if (in_R8D == 0) {
      local_1e0[0] = local_1d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"result","");
      local_238 = NullUniValue.typ;
      local_230[0] = local_220;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_230,NullUniValue.val._M_dataplus._M_p,
                 NullUniValue.val._M_dataplus._M_p + NullUniValue.val._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_210,&NullUniValue.keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_1f8,&NullUniValue.values);
      key_00._M_string_length._4_4_ = in_stack_fffffffffffffcd4;
      key_00._0_12_ = in_stack_fffffffffffffcc8;
      key_00.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffcd8;
      key_00.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffcdc;
      key_00.field_2._8_8_ = in_stack_fffffffffffffce0;
      val_00.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffcf0;
      val_00._0_8_ = in_stack_fffffffffffffce8;
      val_00.val._M_string_length = in_stack_fffffffffffffcf8;
      val_00.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffd00;
      val_00.val.field_2._8_8_ = in_stack_fffffffffffffd08;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffd10;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd18;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd20;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = in_stack_fffffffffffffd28;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd30;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffd38;
      UniValue::pushKV(__return_storage_ptr__,key_00,val_00);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_210);
      if (local_230[0] != local_220) {
        operator_delete(local_230[0],local_220[0] + 1);
      }
      if (local_1e0[0] != local_1d0) {
        operator_delete(local_1e0[0],local_1d0[0] + 1);
      }
    }
    plVar8 = local_248;
    local_258[0] = plVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"error","");
    local_2b0 = *in_RDX;
    plVar10 = (long *)(in_RDX + 6);
    if (*(long **)(in_RDX + 2) == plVar10) {
      local_298 = *plVar10;
      uStack_290 = *(undefined8 *)(in_RDX + 8);
      local_2a8 = &local_298;
    }
    else {
      local_298 = *plVar10;
      local_2a8 = *(long **)(in_RDX + 2);
    }
    local_2a0 = *(undefined8 *)(in_RDX + 4);
    *(long **)(in_RDX + 2) = plVar10;
    in_RDX[4] = 0;
    in_RDX[5] = 0;
    *(undefined1 *)(in_RDX + 6) = 0;
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(in_RDX + 10);
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(in_RDX + 0xc);
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(in_RDX + 0xe);
    in_RDX[0xe] = 0;
    in_RDX[0xf] = 0;
    in_RDX[10] = 0;
    in_RDX[0xb] = 0;
    in_RDX[0xc] = 0;
    in_RDX[0xd] = 0;
    local_270.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)(in_RDX + 0x10);
    local_270.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = *(pointer *)(in_RDX + 0x12);
    local_270.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)(in_RDX + 0x14);
    in_RDX[0x14] = 0;
    in_RDX[0x15] = 0;
    in_RDX[0x10] = 0;
    in_RDX[0x11] = 0;
    in_RDX[0x12] = 0;
    in_RDX[0x13] = 0;
    key_01._M_string_length._4_4_ = in_stack_fffffffffffffcd4;
    key_01._0_12_ = in_stack_fffffffffffffcc8;
    key_01.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffcd8;
    key_01.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffcdc;
    key_01.field_2._8_8_ = in_stack_fffffffffffffce0;
    val_01.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffcf0;
    val_01._0_8_ = in_stack_fffffffffffffce8;
    val_01.val._M_string_length = in_stack_fffffffffffffcf8;
    val_01.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffd00;
    val_01.val.field_2._8_8_ = in_stack_fffffffffffffd08;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffd10;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd18;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd20;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = in_stack_fffffffffffffd28;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd30;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffd38;
    UniValue::pushKV(__return_storage_ptr__,key_01,val_01);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_270);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_288);
    plVar10 = local_258[0];
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
      plVar10 = local_258[0];
    }
LAB_0037556f:
    if (plVar10 != plVar8) {
      operator_delete(plVar10,*plVar8 + 1);
    }
  }
  if (*(char *)(in_RCX + 0x16) == '\x01') {
    plVar8 = local_2c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffd30,"id","");
    if (*(char *)(in_RCX + 0x16) == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00375ac3;
    }
    plVar10 = (long *)(in_RCX + 6);
    if (*(long **)(in_RCX + 2) == plVar10) {
      lVar12 = *plVar10;
      in_stack_fffffffffffffcf8 = *(undefined8 *)(in_RCX + 8);
      plVar11 = (long *)&stack0xfffffffffffffcf0;
    }
    else {
      lVar12 = *plVar10;
      plVar11 = *(long **)(in_RCX + 2);
    }
    uVar1 = *(undefined8 *)(in_RCX + 4);
    *(long **)(in_RCX + 2) = plVar10;
    *(undefined8 *)(in_RCX + 4) = 0;
    *(undefined1 *)(in_RCX + 6) = 0;
    uVar4 = *(undefined8 *)(in_RCX + 10);
    uVar5 = *(undefined8 *)(in_RCX + 0xc);
    uVar2 = *(undefined8 *)(in_RCX + 0xe);
    *(undefined8 *)(in_RCX + 0xe) = 0;
    *(undefined8 *)(in_RCX + 10) = 0;
    *(undefined8 *)(in_RCX + 0xc) = 0;
    uVar6 = *(undefined8 *)(in_RCX + 0x10);
    uVar7 = *(undefined8 *)(in_RCX + 0x12);
    uVar3 = *(undefined8 *)(in_RCX + 0x14);
    *(undefined8 *)(in_RCX + 0x14) = 0;
    *(undefined8 *)(in_RCX + 0x10) = 0;
    *(undefined8 *)(in_RCX + 0x12) = 0;
    key_03._M_string_length._4_4_ = in_stack_fffffffffffffcd4;
    key_03._0_12_ = in_stack_fffffffffffffcc8;
    key_03.field_2._M_allocated_capacity._0_4_ = *in_RCX;
    key_03.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffcdc;
    key_03.field_2._8_8_ = plVar11;
    val_03.val._M_dataplus._M_p = (pointer)lVar12;
    val_03._0_8_ = uVar1;
    val_03.val._M_string_length = in_stack_fffffffffffffcf8;
    val_03.val.field_2._M_allocated_capacity = uVar4;
    val_03.val.field_2._8_8_ = uVar5;
    val_03.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar2;
    val_03.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar6;
    val_03.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar7;
    val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)uVar3;
    val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)plVar8;
    val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffd38;
    UniValue::pushKV(__return_storage_ptr__,key_03,val_03);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffd18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xfffffffffffffd00);
    if (plVar11 != (long *)&stack0xfffffffffffffcf0) {
      operator_delete(plVar11,lVar12 + 1);
    }
    if (plVar8 != local_2c0) {
      operator_delete(plVar8,local_2c0[0] + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00375ac3:
  __stack_chk_fail();
}

Assistant:

UniValue JSONRPCReplyObj(UniValue result, UniValue error, std::optional<UniValue> id, JSONRPCVersion jsonrpc_version)
{
    UniValue reply(UniValue::VOBJ);
    // Add JSON-RPC version number field in v2 only.
    if (jsonrpc_version == JSONRPCVersion::V2) reply.pushKV("jsonrpc", "2.0");

    // Add both result and error fields in v1, even though one will be null.
    // Omit the null field in v2.
    if (error.isNull()) {
        reply.pushKV("result", std::move(result));
        if (jsonrpc_version == JSONRPCVersion::V1_LEGACY) reply.pushKV("error", NullUniValue);
    } else {
        if (jsonrpc_version == JSONRPCVersion::V1_LEGACY) reply.pushKV("result", NullUniValue);
        reply.pushKV("error", std::move(error));
    }
    if (id.has_value()) reply.pushKV("id", std::move(id.value()));
    return reply;
}